

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_special_functions.cc
# Opt level: O0

tuple<float,_float> bounds<float>(float y)

{
  float fVar1;
  int __x;
  tuple<float,_float> *in_RDI;
  float *__a;
  float in_XMM0_Da;
  float fVar2;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  double dVar3;
  _Tuple_impl<0UL,_float,_float> extraout_XMM0_Qa;
  float y_max;
  float y_min;
  float min;
  float eps;
  float tol;
  tuple<float,_float> *__a1;
  tuple<float,_float> *this;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  
  __a1 = in_RDI;
  this = in_RDI;
  local_c = in_XMM0_Da;
  dVar3 = std::log2(5.30498947741318e-315);
  __x = (int)in_RDI;
  fVar2 = SUB84(dVar3,0) * 24.0;
  local_10 = fVar2;
  local_14 = Catch::clara::std::numeric_limits<float>::epsilon();
  fVar1 = local_10;
  local_14 = fVar2 * local_14;
  local_18 = std::numeric_limits<float>::min();
  local_18 = fVar1 * local_18;
  local_1c = (1.0 - local_14) * local_c;
  local_20 = (local_14 + 1.0) * local_c;
  if (local_20 < local_1c) {
    __a = &local_1c;
    std::swap<float>(__a,&local_20);
    __x = (int)__a;
  }
  Catch::clara::std::abs(__x);
  if (extraout_XMM0_Da < local_18) {
    local_1c = -local_18;
  }
  Catch::clara::std::abs(__x);
  if (extraout_XMM0_Da_00 < local_18) {
    local_20 = local_18;
  }
  std::tuple<float,_float>::tuple<float_&,_float_&,_true>(this,(float *)__a1,(float *)0x3b349f);
  return (tuple<float,_float>)extraout_XMM0_Qa;
}

Assistant:

std::tuple<T, T> bounds(T y) {
  const T tol{std::numeric_limits<T>::digits *
              std::log2(static_cast<T>(std::numeric_limits<T>::radix))};
  const T eps{tol * std::numeric_limits<T>::epsilon()};
  const T min{tol * std::numeric_limits<T>::min()};
  T y_min{(1 - eps) * y};
  T y_max{(1 + eps) * y};
  if (y_min > y_max)
    std::swap(y_min, y_max);
  if (std::abs(y_min) < min)
    y_min = -min;
  if (std::abs(y_max) < min)
    y_max = +min;
  return {y_min, y_max};
}